

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  float *pfVar1;
  float fVar2;
  uchar filterType;
  byte bVar3;
  LodePNGColorType LVar4;
  uint uVar5;
  undefined4 uVar6;
  uchar *puVar7;
  void *pvVar8;
  LodePNGFilterStrategy LVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uchar *puVar17;
  long lVar18;
  uchar *puVar19;
  ulong uVar20;
  long lVar21;
  void **outsize;
  int iVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uchar *dummy;
  size_t size [5];
  uchar *attempt [5];
  uint count [256];
  ulong local_4f8;
  uchar *local_4f0;
  uchar *local_4a0;
  void *local_498 [6];
  undefined8 local_468;
  long local_460 [5];
  LodePNGCompressSettings local_438 [21];
  ulong length;
  
  uVar13 = (ulong)h;
  LVar4 = info->colortype;
  iVar22 = 0;
  if ((ulong)LVar4 < 7) {
    iVar22 = *(int *)(&DAT_00113b44 + (ulong)LVar4 * 4);
  }
  iVar22 = iVar22 * info->bitdepth;
  if (iVar22 == 0) {
    return 0x1f;
  }
  LVar9 = settings->filter_strategy;
  if (info->bitdepth < 8) {
    LVar9 = LFS_ZERO;
  }
  if (LVar4 == LCT_PALETTE) {
    LVar9 = LFS_ZERO;
  }
  if (settings->filter_palette_zero == 0) {
    LVar9 = settings->filter_strategy;
  }
  if (LFS_PREDEFINED < LVar9) {
    return 0x58;
  }
  uVar12 = w * iVar22 + 7;
  uVar23 = uVar12 >> 3;
  length = (ulong)uVar23;
  uVar16 = (ulong)(iVar22 + 7U >> 3);
  switch(LVar9) {
  case LFS_ZERO:
    if (h == 0) {
      return 0;
    }
    puVar17 = out + 1;
    uVar16 = 0;
    do {
      out[(length + 1) * uVar16] = '\0';
      if (7 < uVar12) {
        uVar15 = 0;
        do {
          puVar17[uVar15] = in[uVar15];
          uVar15 = uVar15 + 1;
        } while (length != uVar15);
      }
      uVar16 = uVar16 + 1;
      puVar17 = puVar17 + length + 1;
      in = in + length;
    } while (uVar16 != uVar13);
    return 0;
  case LFS_MINSUM:
    local_498[0] = malloc(length);
    if (local_498[0] != (void *)0x0) {
      lVar18 = 1;
      do {
        lVar10 = lVar18;
        if (lVar10 == 5) {
          if (h != 0) {
            puVar17 = out + 1;
            uVar14 = 0;
            local_4f0 = (uchar *)0x0;
            uVar15 = 0;
            puVar19 = (uchar *)0x0;
            do {
              lVar18 = uVar14 * length;
              uVar20 = 0;
              do {
                puVar7 = (uchar *)local_498[uVar20];
                filterScanline(puVar7,in + lVar18,puVar19,length,uVar16,(uchar)uVar20);
                *(undefined8 *)(&local_438[0].btype + uVar20 * 2) = 0;
                if (uVar20 == 0) {
                  if (7 < uVar12) {
                    lVar11 = 0;
                    lVar21 = local_438[0]._0_8_;
                    do {
                      lVar21 = lVar21 + (ulong)puVar7[lVar11];
                      lVar11 = lVar11 + 1;
                    } while (uVar23 != (uint)lVar11);
                    goto LAB_0011213a;
                  }
                }
                else if (7 < uVar12) {
                  lVar21 = *(long *)(&local_438[0].btype + uVar20 * 2);
                  lVar11 = 0;
                  do {
                    bVar3 = puVar7[lVar11];
                    uVar5 = bVar3 ^ 0xff;
                    if (-1 < (char)bVar3) {
                      uVar5 = (uint)bVar3;
                    }
                    lVar21 = lVar21 + (ulong)uVar5;
                    lVar11 = lVar11 + 1;
                  } while (uVar23 != (uint)lVar11);
LAB_0011213a:
                  *(long *)(&local_438[0].btype + uVar20 * 2) = lVar21;
                }
                if ((uVar20 == 0) || (*(ulong *)(&local_438[0].btype + uVar20 * 2) < uVar15)) {
                  uVar15 = *(ulong *)(&local_438[0].btype + uVar20 * 2);
                  local_4f0 = (uchar *)(uVar20 & 0xffffffff);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != 5);
              out[(length + 1) * uVar14] = (uchar)local_4f0;
              if (7 < uVar12) {
                pvVar8 = local_498[(ulong)local_4f0 & 0xff];
                lVar21 = 0;
                do {
                  puVar17[lVar21] = *(uchar *)((long)pvVar8 + lVar21);
                  lVar21 = lVar21 + 1;
                } while (uVar23 != (uint)lVar21);
              }
              uVar14 = uVar14 + 1;
              puVar17 = puVar17 + length + 1;
              puVar19 = in + lVar18;
            } while (uVar14 != uVar13);
          }
          lVar18 = 0;
          do {
            free(local_498[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 5);
          break;
        }
        pvVar8 = malloc(length);
        local_498[lVar10] = pvVar8;
        lVar18 = lVar10 + 1;
      } while (pvVar8 != (void *)0x0);
joined_r0x0011205b:
      if (lVar10 == 5) {
        return 0;
      }
      return 0x53;
    }
    break;
  case LFS_ENTROPY:
    local_498[0] = malloc(length);
    if (local_498[0] != (void *)0x0) {
      lVar18 = 1;
      do {
        lVar10 = lVar18;
        if (lVar10 == 5) {
          if (h != 0) {
            lVar18 = length + 1;
            puVar17 = out + 1;
            fVar2 = 0.0;
            uVar15 = 0;
            local_4f8 = 0;
            puVar19 = (uchar *)0x0;
            do {
              lVar21 = uVar15 * length;
              uVar14 = 0;
              do {
                puVar7 = (uchar *)local_498[uVar14];
                filterScanline(puVar7,in + lVar21,puVar19,length,uVar16,(uchar)uVar14);
                memset(local_438,0,0x400);
                if (7 < uVar12) {
                  lVar11 = 0;
                  do {
                    (&local_438[0].btype)[puVar7[lVar11]] =
                         (&local_438[0].btype)[puVar7[lVar11]] + 1;
                    lVar11 = lVar11 + 1;
                  } while (uVar23 != (uint)lVar11);
                }
                (&local_438[0].btype)[uVar14] = (&local_438[0].btype)[uVar14] + 1;
                *(undefined4 *)((long)local_460 + uVar14 * 4 + -8) = 0;
                fVar24 = 0.0;
                lVar11 = 0;
                do {
                  fVar25 = 0.0;
                  if ((&local_438[0].btype)[lVar11] != 0) {
                    fVar25 = (float)(&local_438[0].btype)[lVar11] / (float)(int)lVar18;
                    fVar27 = 0.0;
                    for (fVar26 = 1.0 / fVar25; 32.0 < fVar26; fVar26 = fVar26 * 0.0625) {
                      fVar27 = fVar27 + 4.0;
                    }
                    for (; 2.0 < fVar26; fVar26 = fVar26 * 0.5) {
                      fVar27 = fVar27 + 1.0;
                    }
                    fVar25 = fVar25 * ((fVar26 * fVar26 * 3.0 * -0.5 +
                                        (fVar26 * fVar26 * fVar26) / 3.0 + fVar26 * 3.0 + -1.83333)
                                       * 1.442695 + fVar27);
                  }
                  fVar24 = fVar24 + fVar25;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0x100);
                *(float *)((long)local_460 + uVar14 * 4 + -8) = fVar24;
                if ((uVar14 == 0) ||
                   (pfVar1 = (float *)((long)local_460 + uVar14 * 4 + -8),
                   *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
                  fVar2 = *(float *)((long)local_460 + uVar14 * 4 + -8);
                  local_4f8 = uVar14 & 0xffffffff;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != 5);
              out[lVar18 * uVar15] = (uchar)local_4f8;
              if (7 < uVar12) {
                pvVar8 = local_498[local_4f8];
                lVar11 = 0;
                do {
                  puVar17[lVar11] = *(uchar *)((long)pvVar8 + lVar11);
                  lVar11 = lVar11 + 1;
                } while (uVar23 != (uint)lVar11);
              }
              uVar15 = uVar15 + 1;
              puVar17 = puVar17 + lVar18;
              puVar19 = in + lVar21;
            } while (uVar15 != uVar13);
          }
          lVar18 = 0;
          do {
            free(local_498[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 5);
          break;
        }
        pvVar8 = malloc(length);
        local_498[lVar10] = pvVar8;
        lVar18 = lVar10 + 1;
      } while (pvVar8 != (void *)0x0);
      goto joined_r0x0011205b;
    }
    break;
  case LFS_BRUTE_FORCE:
    uVar6 = (settings->zlibsettings).use_lz77;
    local_438[0].windowsize = (settings->zlibsettings).windowsize;
    local_438[0].minmatch = (settings->zlibsettings).minmatch;
    local_438[0].nicematch = (settings->zlibsettings).nicematch;
    local_438[0].lazymatching = (settings->zlibsettings).lazymatching;
    local_438[0].custom_context = (settings->zlibsettings).custom_context;
    local_438[0].use_lz77 = uVar6;
    local_438[0].btype = 1;
    local_438[0].custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_438[0].custom_deflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_468 = malloc(length);
    if (local_468 != (void *)0x0) {
      lVar18 = 1;
      do {
        lVar10 = lVar18;
        if (lVar10 == 5) {
          if (h != 0) {
            puVar17 = out + 1;
            uVar15 = 0;
            local_4f8 = 0;
            pvVar8 = (void *)0x0;
            local_4f0 = (uchar *)0x0;
            do {
              lVar18 = uVar15 * length;
              outsize = local_498;
              uVar14 = 0;
              do {
                puVar19 = (uchar *)local_460[uVar14 - 1];
                filterScanline(puVar19,in + lVar18,local_4f0,length,uVar16,(uchar)uVar14);
                *outsize = (void *)0x0;
                local_4a0 = (uchar *)0x0;
                if (local_438[0].custom_zlib ==
                    (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                     *)0x0) {
                  lodepng_zlib_compress(&local_4a0,(size_t *)outsize,puVar19,length,local_438);
                }
                else {
                  (*local_438[0].custom_zlib)(&local_4a0,(size_t *)outsize,puVar19,length,local_438)
                  ;
                }
                free(local_4a0);
                if ((uVar14 == 0) || (*outsize < pvVar8)) {
                  pvVar8 = *outsize;
                  local_4f8 = uVar14 & 0xffffffff;
                }
                uVar14 = uVar14 + 1;
                outsize = outsize + 1;
              } while (uVar14 != 5);
              out[(length + 1) * uVar15] = (uchar)local_4f8;
              if (7 < uVar12) {
                lVar21 = local_460[local_4f8 - 1];
                lVar11 = 0;
                do {
                  puVar17[lVar11] = *(uchar *)(lVar21 + lVar11);
                  lVar11 = lVar11 + 1;
                } while (uVar23 != (uint)lVar11);
              }
              uVar15 = uVar15 + 1;
              puVar17 = puVar17 + length + 1;
              local_4f0 = in + lVar18;
            } while (uVar15 != uVar13);
          }
          lVar18 = 0;
          do {
            free((void *)local_460[lVar18 + -1]);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 5);
          break;
        }
        pvVar8 = malloc(length);
        local_460[lVar10 + -1] = (long)pvVar8;
        lVar18 = lVar10 + 1;
      } while (pvVar8 != (void *)0x0);
      goto joined_r0x0011205b;
    }
    break;
  case LFS_PREDEFINED:
    if (h != 0) {
      puVar19 = out + 1;
      uVar15 = 0;
      puVar17 = (uchar *)0x0;
      do {
        puVar7 = in;
        filterType = settings->predefined_filters[uVar15];
        puVar19[-1] = filterType;
        filterScanline(puVar19,puVar7,puVar17,length,uVar16,filterType);
        uVar15 = uVar15 + 1;
        puVar19 = puVar19 + length + 1;
        in = puVar7 + length;
        puVar17 = puVar7;
      } while (uVar13 != uVar15);
    }
    return 0;
  }
  return 0x53;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}